

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExecMMU_cpp.h
# Opt level: O1

bool __thiscall moira::Moira::isValidExtMMU(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  uint uVar1;
  anon_class_4_1_ba1d4581 preg;
  byte bVar2;
  
  switch(I) {
  case PFLUSH:
    uVar1 = ext >> 10 & 7;
    if (uVar1 == 4) goto LAB_0012ed9b;
    if (uVar1 == 6) goto switchD_0012ed71_caseD_b7;
    break;
  case PFLUSHA:
    if ((ext & 0x1e0) == 0 && (char)op == '\0') {
      bVar2 = (ext & 0x1f) == 0;
      goto LAB_0012eeb5;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraExecMMU_cpp.h"
                  ,0x6e,"bool moira::Moira::isValidExtMMU(Instr, Mode, u16, u32) const");
  case PLOAD:
switchD_0012ed71_caseD_b7:
    if ((M - DI < 4) || (M == AI)) {
LAB_0012ed9b:
      bVar2 = (ext & 0x1e) - 8 < 0xfffffffa;
      goto LAB_0012eeb5;
    }
    break;
  case PMOVE:
    bVar2 = 0;
    if ((M == IP) || ((M - DIPC < 3 & (byte)(ext >> 9) & 1) != 0)) goto LAB_0012eeb5;
    uVar1 = ext >> 0xd & 7;
    bVar2 = 1;
    if (uVar1 == 3) goto LAB_0012eeb5;
    if (uVar1 == 2) {
      if ((((ext & 0x300) != 0x300) &&
          (((((ext & 0x300) != 0 || ((ext & 0x1c00) == 0)) || (IM < M)) ||
           ((0x818U >> (M & 0x1f) & 1) == 0)))) &&
         (((ext >> 8 & 1) != 0 || (AN < M || (ext & 0x1c00) == 0)))) goto LAB_0012eeb5;
    }
    else if ((uVar1 == 0) && ((ext & 0x1800) == 0x800)) {
      bVar2 = (~ext & 0x300) != 0;
      goto LAB_0012eeb5;
    }
    break;
  case PTEST:
    if (((ext >> 8 & 1) != 0 || (ext & 0xe0) == 0) &&
       (((ext & 6) == 0 || (ext & 0x18) != 0) && M < DIPC)) {
      bVar2 = (byte)(0x1e4 >> ((byte)M & 0x1f));
      goto LAB_0012eeb5;
    }
  }
  bVar2 = 0;
LAB_0012eeb5:
  return (bool)(bVar2 & 1);
}

Assistant:

bool
Moira::isValidExtMMU(Instr I, Mode M, u16 op, u32 ext) const
{
    auto preg  = [ext]() { return ext >> 10 & 0b111;   };
    auto a     = [ext]() { return ext >>  8 & 0b1;     };
    auto mode  = [ext]() { return ext >> 10 & 0b111;   };
    auto mask  = [ext]() { return ext >>  5 & 0b1111;  }; // 68851 mask is 4 bit
    auto reg   = [ext]() { return ext >>  5 & 0b111;   };
    auto fc    = [ext]() { return ext       & 0b11111; };

    auto validFC = [&]() {
        return fc() <= 1 || (fc() >= 8); // Binutils checks M68851
    };

    switch (I) {

        case Instr::PFLUSHA:

            return (op & 0xFF) == 0 && mask() == 0 && fc() == 0;

        case Instr::PFLUSH:

            // Check mode
            if (mode() != 0b100 && mode() != 0b110) return false;

            // Check EA mode
            if (mode() == 0b110) {
                if (M != Mode::AI && M != Mode::DI && M != Mode::IX && M != Mode::AW && M != Mode::AL) {
                    return false;
                }
            }
            return validFC();

        case Instr::PLOAD:

            // Check EA mode
            if (M != Mode::AI && M != Mode::DI && M != Mode::IX && M != Mode::AW && M != Mode::AL) {
                return false;
            }

            return validFC();

        case Instr::PMOVE:

            if ((ext & 0x200)) {
                if (M == Mode::DIPC || M == Mode::IXPC || M == Mode::IM) return false;
            }
            if (M == Mode::IP) return false;

            switch (ext >> 13 & 0b111) {

                case 0b000:

                    // Check register field
                    if (preg() != 0b010 && preg() != 0b011) return false;

                    // If memory is written, flushing is mandatory
                    if ((ext & 0x300) == 0x300) return false;
                    return true;

                case 0b010:

                    // If memory is written, flushing is mandatory
                    if ((ext & 0x300) == 0x300) return false;

                    if ((ext & 0x300) == 0) {
                        if (preg() != 0) {
                            if (M == Mode::PI || M == Mode::PD || M == Mode::IM || M == Mode::IP) return false;
                        }
                    }

                    // Check register field (binutils accepts all M68851 registers)
                    if ((ext & 0x100) == 0) {
                        if (preg() != 0) {
                            if (M == Mode::DN || M == Mode::AN) return false;
                        }
                    }
                    return true;

                case 0b011:

                    return true;

                default:
                    return false;
            }
            break;

        case Instr::PTEST:

            // When A is 0, reg must be 0
            if (a() == 0 && reg() != 0) return false;

            // Check FC
            if ((fc() & 0b11000) == 0 && (fc() & 0b110) != 0) return false;

            // Check EA mode
            if (M != Mode::AI && M != Mode::DI && M != Mode::IX && M != Mode::AW && M != Mode::AL) return false;

            return true;

        default:
            fatalError;
    }
}